

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheatSheetTest.cpp
# Opt level: O3

void __thiscall
TEST_CheatSheet_TestName_Test::~TEST_CheatSheet_TestName_Test(TEST_CheatSheet_TestName_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(CheatSheet, TestName)
{
    /* Check two longs are equal */
    LONGS_EQUAL(1, 1);

    /* Check a condition */
    CHECK(true == true);

    /* Check a string */
    STRCMP_EQUAL("HelloWorld", "HelloWorld");
}